

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# region.c
# Opt level: O3

int fits_in_region(double X,double Y,SAORegion *Rgn)

{
  double *pdVar1;
  bool bVar2;
  bool bVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  uint uVar6;
  undefined4 uVar7;
  int iVar8;
  uint uVar9;
  int iVar10;
  ulong uVar11;
  ulong uVar12;
  int iVar13;
  RgnShape *pRVar14;
  bool bVar15;
  bool bVar16;
  bool bVar17;
  long lVar18;
  double dVar19;
  double dVar20;
  double dVar21;
  double dVar22;
  double dVar26;
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined4 uVar27;
  double dVar28;
  double dVar29;
  
  iVar8 = Rgn->nShapes;
  if (iVar8 < 1) {
    return 0;
  }
  pRVar14 = Rgn->Shapes;
  iVar10 = pRVar14->comp;
  uVar9 = 0;
  bVar16 = false;
  iVar13 = 0;
  do {
    if ((iVar13 == 0) || (pRVar14->comp != iVar10)) {
      bVar16 = bVar16 || uVar9 != 0;
      uVar9 = (uint)(pRVar14->sign == '\0');
      iVar10 = pRVar14->comp;
    }
    if (uVar9 == 0) {
      uVar9 = 0;
      if (pRVar14->sign != '\0') goto LAB_001bc0f9;
      uVar9 = 0;
      goto LAB_001bca97;
    }
    uVar9 = 1;
    if (pRVar14->sign != '\0') goto LAB_001bca97;
LAB_001bc0f9:
    switch(pRVar14->shape) {
    case point_rgn:
      dVar29 = X - (pRVar14->param).gen.p[0];
      dVar26 = Y - (pRVar14->param).gen.p[1];
      uVar6 = -(uint)((dVar26 < 0.5 && -0.5 <= dVar26) && (dVar29 < 0.5 && -0.5 <= dVar29));
LAB_001bc6b3:
      uVar6 = uVar6 & 1;
      break;
    case line_rgn:
      dVar26 = X - (pRVar14->param).gen.p[0];
      dVar28 = Y - (pRVar14->param).gen.p[1];
      dVar29 = (pRVar14->param).gen.sinT;
      dVar20 = (pRVar14->param).gen.cosT;
      dVar19 = -dVar26 * dVar29 + dVar20 * dVar28;
      dVar26 = dVar26 * dVar20 + dVar29 * dVar28;
      lVar18 = -(ulong)(dVar26 < -0.5);
      auVar4._8_4_ = (int)lVar18;
      auVar4._0_8_ = -(ulong)(dVar19 < -0.5);
      auVar4._12_4_ = (int)((ulong)lVar18 >> 0x20);
      uVar7 = movmskpd(uVar9,auVar4);
      if ((((0.5 <= dVar19 | (byte)uVar7 | (byte)uVar7 >> 1) & 1) == 0) &&
         (uVar6 = 1, dVar26 < (pRVar14->param).gen.a)) break;
      goto LAB_001bc80a;
    case circle_rgn:
      dVar29 = X - (pRVar14->param).gen.p[0];
      dVar26 = Y - (pRVar14->param).gen.p[1];
      dVar26 = dVar29 * dVar29 + dVar26 * dVar26;
      pdVar1 = &(pRVar14->param).gen.a;
      bVar17 = dVar26 == *pdVar1;
      bVar15 = dVar26 < *pdVar1;
      goto LAB_001bc7ff;
    case annulus_rgn:
      dVar29 = X - (pRVar14->param).gen.p[0];
      dVar26 = Y - (pRVar14->param).gen.p[1];
      dVar26 = dVar29 * dVar29 + dVar26 * dVar26;
      if (dVar26 < (pRVar14->param).gen.a) goto LAB_001bc80a;
      pdVar1 = &(pRVar14->param).gen.b;
      bVar17 = dVar26 == *pdVar1;
      bVar15 = dVar26 < *pdVar1;
      goto LAB_001bc7ff;
    case ellipse_rgn:
      dVar19 = X - (pRVar14->param).gen.p[0];
      dVar20 = Y - (pRVar14->param).gen.p[1];
      dVar26 = (pRVar14->param).gen.sinT;
      dVar29 = (pRVar14->param).gen.cosT;
      dVar28 = (dVar19 * dVar29 + dVar20 * dVar26) / (pRVar14->param).gen.p[2];
      dVar26 = (dVar20 * dVar29 - dVar19 * dVar26) / (pRVar14->param).gen.p[3];
      dVar26 = dVar28 * dVar28 + dVar26 * dVar26;
      bVar17 = dVar26 == 1.0;
      bVar15 = dVar26 < 1.0;
      goto LAB_001bc7ff;
    case elliptannulus_rgn:
      dVar19 = X - (pRVar14->param).gen.p[0];
      dVar20 = Y - (pRVar14->param).gen.p[1];
      dVar26 = (pRVar14->param).gen.sinT;
      dVar29 = (pRVar14->param).gen.cosT;
      dVar28 = (dVar19 * dVar29 + dVar20 * dVar26) / (pRVar14->param).gen.p[4];
      dVar26 = (dVar29 * dVar20 - dVar26 * dVar19) / (pRVar14->param).gen.p[5];
      uVar6 = 0;
      if (dVar28 * dVar28 + dVar26 * dVar26 <= 1.0) {
        dVar26 = (pRVar14->param).gen.a;
        dVar29 = (pRVar14->param).gen.b;
        dVar28 = (dVar19 * dVar29 + dVar20 * dVar26) / (pRVar14->param).gen.p[2];
        dVar26 = (-dVar19 * dVar26 + dVar20 * dVar29) / (pRVar14->param).gen.p[3];
        dVar26 = dVar28 * dVar28 + dVar26 * dVar26;
        bVar17 = dVar26 == 1.0;
        bVar15 = 1.0 < dVar26;
        goto LAB_001bc7ff;
      }
      break;
    case box_rgn:
      dVar19 = X - (pRVar14->param).gen.p[0];
      dVar26 = Y - (pRVar14->param).gen.p[1];
      dVar29 = (pRVar14->param).gen.sinT;
      dVar20 = (pRVar14->param).gen.cosT;
      dVar28 = dVar19 * dVar20 + dVar26 * dVar29;
      dVar26 = -dVar19 * dVar29 + dVar26 * dVar20;
      dVar29 = (pRVar14->param).gen.p[2] * 0.5;
      dVar20 = (pRVar14->param).gen.p[3] * 0.5;
      bVar17 = dVar28 <= dVar29;
      bVar2 = dVar26 <= dVar20;
      bVar15 = -dVar29 <= dVar28;
      bVar3 = -dVar20 <= dVar26;
      goto LAB_001bca0e;
    case boxannulus_rgn:
      dVar29 = X - (pRVar14->param).gen.p[0];
      dVar26 = Y - (pRVar14->param).gen.p[1];
      dVar19 = (pRVar14->param).gen.cosT * dVar29 + dVar26 * (pRVar14->param).gen.sinT;
      dVar20 = (pRVar14->param).gen.p[4] * 0.5;
      uVar6 = 0;
      if (((-dVar20 <= dVar19) && (dVar19 <= dVar20)) && (-dVar20 <= dVar19 && dVar19 <= dVar20)) {
        dVar20 = (pRVar14->param).gen.a;
        dVar19 = (pRVar14->param).gen.b;
        dVar28 = dVar29 * dVar19 + dVar26 * dVar20;
        dVar26 = -dVar29 * dVar20 + dVar26 * dVar19;
        dVar29 = (pRVar14->param).gen.p[2] * 0.5;
        dVar20 = (pRVar14->param).gen.p[3] * 0.5;
        uVar6 = (uint)(byte)(-(dVar20 < dVar26) | -(dVar26 < -dVar20) |
                            -(dVar28 < -dVar29) | dVar29 < dVar28);
        goto LAB_001bc6b3;
      }
      break;
    case rectangle_rgn:
      dVar21 = X - (pRVar14->param).gen.p[5];
      dVar26 = Y - (pRVar14->param).gen.p[6];
      dVar29 = (pRVar14->param).gen.sinT;
      dVar20 = (pRVar14->param).gen.cosT;
      dVar19 = (pRVar14->param).gen.a;
      dVar28 = (pRVar14->param).gen.b;
      dVar22 = dVar21 * dVar20 + dVar26 * dVar29;
      dVar26 = -dVar21 * dVar29 + dVar26 * dVar20;
      bVar17 = dVar22 <= dVar19;
      bVar2 = dVar26 <= dVar28;
      bVar15 = -dVar19 <= dVar22;
      bVar3 = -dVar28 <= dVar26;
LAB_001bca0e:
      auVar25._0_8_ = (-(ulong)bVar15 & -(ulong)bVar17) << 0x3f;
      auVar25._8_8_ = (-(ulong)bVar3 & -(ulong)bVar2) << 0x3f;
      iVar8 = movmskpd(uVar9,auVar25);
      uVar6 = (uint)(iVar8 == 3);
      break;
    case diamond_rgn:
      dVar19 = X - (pRVar14->param).gen.p[0];
      dVar26 = Y - (pRVar14->param).gen.p[1];
      dVar29 = (pRVar14->param).gen.sinT;
      dVar20 = (pRVar14->param).gen.cosT;
      auVar23._0_8_ = dVar19 * dVar20 + dVar26 * dVar29;
      auVar23._8_8_ = -dVar19 * dVar29 + dVar26 * dVar20;
      auVar5._8_8_ = (pRVar14->param).gen.p[3] * 0.5;
      auVar5._0_8_ = (pRVar14->param).gen.p[2] * 0.5;
      auVar24 = divpd(auVar23,auVar5);
      dVar26 = ABS(auVar24._8_8_) + ABS(auVar24._0_8_);
      bVar17 = dVar26 == 1.0;
      bVar15 = dVar26 < 1.0;
LAB_001bc7ff:
      uVar6 = 1;
      if (!bVar15 && !bVar17) {
LAB_001bc80a:
        uVar6 = 0;
      }
      break;
    case sector_rgn:
      dVar26 = X - (pRVar14->param).gen.p[0];
      dVar19 = Y - (pRVar14->param).gen.p[1];
LAB_001bc94c:
      if ((dVar26 == 0.0) && (!NAN(dVar26))) {
        uVar6 = 1;
        if ((dVar19 == 0.0) && (!NAN(dVar19))) break;
      }
LAB_001bc967:
      dVar26 = atan2(dVar19,dVar26);
      dVar20 = (dVar26 * 180.0) / 3.141592653589793;
      dVar26 = (pRVar14->param).gen.p[2];
      dVar29 = (pRVar14->param).gen.p[3];
      if (dVar26 <= dVar29) {
        bVar17 = dVar20 <= dVar29 && dVar26 <= dVar20;
      }
      else {
        bVar17 = dVar26 <= dVar20 || dVar20 <= dVar29;
      }
      uVar6 = -(uint)bVar17 & 1;
      break;
    case poly_rgn:
      uVar6 = 0;
      if ((pRVar14->xmin <= X) &&
         (((X < pRVar14->xmax || X == pRVar14->xmax && (pRVar14->ymin <= Y)) &&
          (Y < pRVar14->ymax || Y == pRVar14->ymax)))) {
        iVar8 = (pRVar14->param).poly.nPts;
        if (0 < (long)iVar8) {
          pdVar1 = (pRVar14->param).poly.Pts;
          uVar7 = SUB84(pdVar1[(long)iVar8 + -2],0);
          uVar27 = (undefined4)((ulong)pdVar1[(long)iVar8 + -2] >> 0x20);
          uVar11 = 0;
          uVar6 = 0;
          dVar26 = pdVar1[iVar8 - 1U];
          do {
            dVar19 = (double)CONCAT44(uVar27,uVar7);
            dVar29 = pdVar1[uVar11];
            uVar7 = SUB84(dVar29,0);
            uVar27 = (undefined4)((ulong)dVar29 >> 0x20);
            dVar20 = pdVar1[uVar11 + 1];
            if ((((Y <= dVar26) || (Y < dVar20)) && ((dVar26 <= Y || (dVar20 < Y)))) &&
               ((X <= dVar19 || (X < dVar29)))) {
              if ((dVar19 <= X) || (dVar29 < X)) {
                if (1e-10 <= ABS(dVar20 - dVar26)) {
                  dVar29 = (((dVar29 - dVar19) / (dVar20 - dVar26)) * (Y - dVar26) + dVar19) - X;
                  if (-1e-10 <= dVar29) {
                    if (1e-10 <= dVar29) goto LAB_001bc30b;
                    goto switchD_001bc10e_default;
                  }
                }
                else if (ABS(Y - dVar26) < 1e-10) goto switchD_001bc10e_default;
              }
              else {
LAB_001bc30b:
                if ((dVar26 == Y) && (!NAN(dVar26) && !NAN(Y))) {
                  uVar12 = uVar11 | 1;
                  do {
                    uVar9 = (int)uVar12 - 2;
                    if ((int)uVar12 < 2) {
                      uVar9 = iVar8 - 1U;
                    }
                    uVar12 = (ulong)uVar9;
                    dVar26 = pdVar1[(int)uVar9];
                  } while ((dVar26 == Y) && (!NAN(dVar26) && !NAN(Y)));
                  if ((Y - dVar26) * (dVar20 - Y) <= 0.0) goto LAB_001bc3fa;
                }
                uVar6 = 1 - uVar6;
              }
            }
LAB_001bc3fa:
            uVar11 = uVar11 + 2;
            dVar26 = dVar20;
          } while ((int)uVar11 < iVar8);
        }
      }
      break;
    case panda_rgn:
      dVar26 = X - (pRVar14->param).gen.p[0];
      dVar19 = Y - (pRVar14->param).gen.p[1];
      dVar29 = dVar26 * dVar26 + dVar19 * dVar19;
      uVar6 = 0;
      if (((pRVar14->param).gen.a <= dVar29) &&
         (pdVar1 = &(pRVar14->param).gen.b, dVar29 < *pdVar1 || dVar29 == *pdVar1))
      goto LAB_001bc94c;
      break;
    case epanda_rgn:
      dVar26 = X - (pRVar14->param).gen.p[0];
      dVar28 = Y - (pRVar14->param).gen.p[1];
      dVar29 = (pRVar14->param).gen.sinT;
      dVar20 = (pRVar14->param).gen.cosT;
      dVar19 = -dVar26 * dVar29 + dVar20 * dVar28;
      dVar26 = dVar26 * dVar20 + dVar29 * dVar28;
      dVar29 = dVar26 / (pRVar14->param).gen.p[7];
      dVar20 = dVar19 / (pRVar14->param).gen.p[8];
      uVar6 = 0;
      if ((dVar29 * dVar29 + dVar20 * dVar20 <= 1.0) &&
         (dVar29 = dVar26 / (pRVar14->param).gen.p[5], dVar20 = dVar19 / (pRVar14->param).gen.p[6],
         1.0 <= dVar29 * dVar29 + dVar20 * dVar20)) {
LAB_001bc8b1:
        auVar24._8_8_ = -(ulong)(dVar26 != 0.0);
        auVar24._0_8_ = -(ulong)(dVar19 != 0.0);
        iVar8 = movmskpd(uVar9,auVar24);
        uVar6 = 1;
        if (iVar8 == 0) break;
        goto LAB_001bc967;
      }
      break;
    case bpanda_rgn:
      dVar26 = X - (pRVar14->param).gen.p[0];
      dVar28 = Y - (pRVar14->param).gen.p[1];
      dVar29 = (pRVar14->param).gen.sinT;
      dVar20 = (pRVar14->param).gen.cosT;
      dVar19 = -dVar26 * dVar29 + dVar20 * dVar28;
      dVar26 = dVar26 * dVar20 + dVar29 * dVar28;
      dVar29 = (pRVar14->param).gen.p[7] * 0.5;
      uVar6 = 0;
      if (((((-dVar29 <= dVar26) && (dVar26 <= dVar29)) &&
           (dVar29 = (pRVar14->param).gen.p[8] * 0.5, -dVar29 <= dVar19)) && (dVar19 <= dVar29)) &&
         (((dVar29 = (pRVar14->param).gen.p[5] * 0.5, dVar26 < -dVar29 || (dVar29 < dVar26)) ||
          ((dVar29 = (pRVar14->param).gen.p[6] * 0.5, dVar19 < -dVar29 || (dVar29 < dVar19))))))
      goto LAB_001bc8b1;
      break;
    default:
switchD_001bc10e_default:
      uVar6 = 1;
    }
    uVar9 = pRVar14->sign == '\0' ^ uVar6;
    iVar8 = Rgn->nShapes;
LAB_001bca97:
    iVar13 = iVar13 + 1;
    pRVar14 = pRVar14 + 1;
    if (iVar8 <= iVar13) {
      return (uint)(bVar16 || uVar9 != 0);
    }
  } while( true );
}

Assistant:

int fits_in_region( double    X,
            double    Y,
            SAORegion *Rgn )
/*  Test if the given point is within the region described by Rgn.  X and    */
/*  Y are in pixel coordinates.                                              */
/*---------------------------------------------------------------------------*/
{
   double x, y, dx, dy, xprime, yprime, r, th;
   RgnShape *Shapes;
   int i, cur_comp;
   int result, comp_result;

   Shapes = Rgn->Shapes;

   result = 0;
   comp_result = 0;
   cur_comp = Rgn->Shapes[0].comp;

   for( i=0; i<Rgn->nShapes; i++, Shapes++ ) {

     /* if this region has a different component number to the last one  */
     /*	then replace the accumulated selection logical with the union of */
     /*	the current logical and the total logical. Reinitialize the      */
     /* temporary logical.                                               */

     if ( i==0 || Shapes->comp != cur_comp ) {
       result = result || comp_result;
       cur_comp = Shapes->comp;
       /* if an excluded region is given first, then implicitly   */
       /* assume a previous shape that includes the entire image. */
       comp_result = !Shapes->sign;
     }

    /* only need to test if  */
    /*   the point is not already included and this is an include region, */
    /* or the point is included and this is an excluded region */

    if ( (!comp_result && Shapes->sign) || (comp_result && !Shapes->sign) ) { 

      comp_result = 1;

      switch( Shapes->shape ) {

      case box_rgn:
         /*  Shift origin to center of region  */
         xprime = X - Shapes->param.gen.p[0];
         yprime = Y - Shapes->param.gen.p[1];

         /*  Rotate point to region's orientation  */
         x =  xprime * Shapes->param.gen.cosT + yprime * Shapes->param.gen.sinT;
         y = -xprime * Shapes->param.gen.sinT + yprime * Shapes->param.gen.cosT;

         dx = 0.5 * Shapes->param.gen.p[2];
         dy = 0.5 * Shapes->param.gen.p[3];
         if( (x < -dx) || (x > dx) || (y < -dy) || (y > dy) )
            comp_result = 0;
         break;

      case boxannulus_rgn:
         /*  Shift origin to center of region  */
         xprime = X - Shapes->param.gen.p[0];
         yprime = Y - Shapes->param.gen.p[1];

         /*  Rotate point to region's orientation  */
         x =  xprime * Shapes->param.gen.cosT + yprime * Shapes->param.gen.sinT;
         y = -xprime * Shapes->param.gen.sinT + yprime * Shapes->param.gen.cosT;

         dx = 0.5 * Shapes->param.gen.p[4];
         dy = 0.5 * Shapes->param.gen.p[5];
         if( (x < -dx) || (x > dx) || (y < -dy) || (y > dy) ) {
	   comp_result = 0;
	 } else {
	   /* Repeat test for inner box */
	   x =  xprime * Shapes->param.gen.b + yprime * Shapes->param.gen.a;
	   y = -xprime * Shapes->param.gen.a + yprime * Shapes->param.gen.b;
	   
	   dx = 0.5 * Shapes->param.gen.p[2];
	   dy = 0.5 * Shapes->param.gen.p[3];
	   if( (x >= -dx) && (x <= dx) && (y >= -dy) && (y <= dy) )
	     comp_result = 0;
	 }
         break;

      case rectangle_rgn:
         /*  Shift origin to center of region  */
         xprime = X - Shapes->param.gen.p[5];
         yprime = Y - Shapes->param.gen.p[6];

         /*  Rotate point to region's orientation  */
         x =  xprime * Shapes->param.gen.cosT + yprime * Shapes->param.gen.sinT;
         y = -xprime * Shapes->param.gen.sinT + yprime * Shapes->param.gen.cosT;

         dx = Shapes->param.gen.a;
         dy = Shapes->param.gen.b;
         if( (x < -dx) || (x > dx) || (y < -dy) || (y > dy) )
            comp_result = 0;
         break;

      case diamond_rgn:
         /*  Shift origin to center of region  */
         xprime = X - Shapes->param.gen.p[0];
         yprime = Y - Shapes->param.gen.p[1];

         /*  Rotate point to region's orientation  */
         x =  xprime * Shapes->param.gen.cosT + yprime * Shapes->param.gen.sinT;
         y = -xprime * Shapes->param.gen.sinT + yprime * Shapes->param.gen.cosT;

         dx = 0.5 * Shapes->param.gen.p[2];
         dy = 0.5 * Shapes->param.gen.p[3];
         r  = fabs(x/dx) + fabs(y/dy);
         if( r > 1 )
            comp_result = 0;
         break;

      case circle_rgn:
         /*  Shift origin to center of region  */
         x = X - Shapes->param.gen.p[0];
         y = Y - Shapes->param.gen.p[1];

         r  = x*x + y*y;
         if ( r > Shapes->param.gen.a )
            comp_result = 0;
         break;

      case annulus_rgn:
         /*  Shift origin to center of region  */
         x = X - Shapes->param.gen.p[0];
         y = Y - Shapes->param.gen.p[1];

         r = x*x + y*y;
         if ( r < Shapes->param.gen.a || r > Shapes->param.gen.b )
            comp_result = 0;
         break;

      case sector_rgn:
         /*  Shift origin to center of region  */
         x = X - Shapes->param.gen.p[0];
         y = Y - Shapes->param.gen.p[1];

         if( x || y ) {
            r = atan2( y, x ) * RadToDeg;
            if( Shapes->param.gen.p[2] <= Shapes->param.gen.p[3] ) {
               if( r < Shapes->param.gen.p[2] || r > Shapes->param.gen.p[3] )
                  comp_result = 0;
            } else {
               if( r < Shapes->param.gen.p[2] && r > Shapes->param.gen.p[3] )
                  comp_result = 0;
            }
         }
         break;

      case ellipse_rgn:
         /*  Shift origin to center of region  */
         xprime = X - Shapes->param.gen.p[0];
         yprime = Y - Shapes->param.gen.p[1];

         /*  Rotate point to region's orientation  */
         x =  xprime * Shapes->param.gen.cosT + yprime * Shapes->param.gen.sinT;
         y = -xprime * Shapes->param.gen.sinT + yprime * Shapes->param.gen.cosT;

         x /= Shapes->param.gen.p[2];
         y /= Shapes->param.gen.p[3];
         r = x*x + y*y;
         if( r>1.0 )
            comp_result = 0;
         break;

      case elliptannulus_rgn:
         /*  Shift origin to center of region  */
         xprime = X - Shapes->param.gen.p[0];
         yprime = Y - Shapes->param.gen.p[1];

         /*  Rotate point to outer ellipse's orientation  */
         x =  xprime * Shapes->param.gen.cosT + yprime * Shapes->param.gen.sinT;
         y = -xprime * Shapes->param.gen.sinT + yprime * Shapes->param.gen.cosT;

         x /= Shapes->param.gen.p[4];
         y /= Shapes->param.gen.p[5];
         r = x*x + y*y;
         if( r>1.0 )
            comp_result = 0;
         else {
            /*  Repeat test for inner ellipse  */
            x =  xprime * Shapes->param.gen.b + yprime * Shapes->param.gen.a;
            y = -xprime * Shapes->param.gen.a + yprime * Shapes->param.gen.b;

            x /= Shapes->param.gen.p[2];
            y /= Shapes->param.gen.p[3];
            r = x*x + y*y;
            if( r<1.0 )
               comp_result = 0;
         }
         break;

      case line_rgn:
         /*  Shift origin to first point of line  */
         xprime = X - Shapes->param.gen.p[0];
         yprime = Y - Shapes->param.gen.p[1];

         /*  Rotate point to line's orientation  */
         x =  xprime * Shapes->param.gen.cosT + yprime * Shapes->param.gen.sinT;
         y = -xprime * Shapes->param.gen.sinT + yprime * Shapes->param.gen.cosT;

         if( (y < -0.5) || (y >= 0.5) || (x < -0.5)
             || (x >= Shapes->param.gen.a) )
            comp_result = 0;
         break;

      case point_rgn:
         /*  Shift origin to center of region  */
         x = X - Shapes->param.gen.p[0];
         y = Y - Shapes->param.gen.p[1];

         if ( (x<-0.5) || (x>=0.5) || (y<-0.5) || (y>=0.5) )
            comp_result = 0;
         break;

      case poly_rgn:
         if( X<Shapes->xmin || X>Shapes->xmax
             || Y<Shapes->ymin || Y>Shapes->ymax )
            comp_result = 0;
         else
            comp_result = Pt_in_Poly( X, Y, Shapes->param.poly.nPts,
                                       Shapes->param.poly.Pts );
         break;

      case panda_rgn:
         /*  Shift origin to center of region  */
         x = X - Shapes->param.gen.p[0];
         y = Y - Shapes->param.gen.p[1];

         r = x*x + y*y;
         if ( r < Shapes->param.gen.a || r > Shapes->param.gen.b ) {
	   comp_result = 0;
	 } else {
	   if( x || y ) {
	     th = atan2( y, x ) * RadToDeg;
	     if( Shapes->param.gen.p[2] <= Shapes->param.gen.p[3] ) {
               if( th < Shapes->param.gen.p[2] || th > Shapes->param.gen.p[3] )
		 comp_result = 0;
	     } else {
               if( th < Shapes->param.gen.p[2] && th > Shapes->param.gen.p[3] )
		 comp_result = 0;
	     }
	   }
         }
         break;

      case epanda_rgn:
         /*  Shift origin to center of region  */
         xprime = X - Shapes->param.gen.p[0];
         yprime = Y - Shapes->param.gen.p[1];

         /*  Rotate point to region's orientation  */
         x =  xprime * Shapes->param.gen.cosT + yprime * Shapes->param.gen.sinT;
         y = -xprime * Shapes->param.gen.sinT + yprime * Shapes->param.gen.cosT;
	 xprime = x;
	 yprime = y;

	 /* outer region test */
         x = xprime/Shapes->param.gen.p[7];
         y = yprime/Shapes->param.gen.p[8];
         r = x*x + y*y;
	 if ( r>1.0 )
	   comp_result = 0;
	 else {
	   /* inner region test */
	   x = xprime/Shapes->param.gen.p[5];
	   y = yprime/Shapes->param.gen.p[6];
	   r = x*x + y*y;
	   if ( r<1.0 )
	     comp_result = 0;
	   else {
	     /* angle test */
	     if( xprime || yprime ) {
	       th = atan2( yprime, xprime ) * RadToDeg;
	       if( Shapes->param.gen.p[2] <= Shapes->param.gen.p[3] ) {
		 if( th < Shapes->param.gen.p[2] || th > Shapes->param.gen.p[3] )
		   comp_result = 0;
	       } else {
		 if( th < Shapes->param.gen.p[2] && th > Shapes->param.gen.p[3] )
		   comp_result = 0;
	       }
	     }
	   }
	 }
         break;

      case bpanda_rgn:
         /*  Shift origin to center of region  */
         xprime = X - Shapes->param.gen.p[0];
         yprime = Y - Shapes->param.gen.p[1];

         /*  Rotate point to region's orientation  */
         x =  xprime * Shapes->param.gen.cosT + yprime * Shapes->param.gen.sinT;
         y = -xprime * Shapes->param.gen.sinT + yprime * Shapes->param.gen.cosT;

	 /* outer box test */
         dx = 0.5 * Shapes->param.gen.p[7];
         dy = 0.5 * Shapes->param.gen.p[8];
         if( (x < -dx) || (x > dx) || (y < -dy) || (y > dy) )
	   comp_result = 0;
	 else {
	   /* inner box test */
	   dx = 0.5 * Shapes->param.gen.p[5];
	   dy = 0.5 * Shapes->param.gen.p[6];
	   if( (x >= -dx) && (x <= dx) && (y >= -dy) && (y <= dy) )
	     comp_result = 0;
	   else {
	     /* angle test */
	     if( x || y ) {
	       th = atan2( y, x ) * RadToDeg;
	       if( Shapes->param.gen.p[2] <= Shapes->param.gen.p[3] ) {
		 if( th < Shapes->param.gen.p[2] || th > Shapes->param.gen.p[3] )
		   comp_result = 0;
	       } else {
		 if( th < Shapes->param.gen.p[2] && th > Shapes->param.gen.p[3] )
		   comp_result = 0;
	       }
	     }
	   }
	 }
         break;
      }

      if( !Shapes->sign ) comp_result = !comp_result;

     } 

   }

   result = result || comp_result;
   
   return( result );
}